

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O3

cbtScalar __thiscall
cbtCollisionWorld::
objectQuerySingleInternal(cbtConvexShape_const*,cbtTransform_const&,cbtTransform_const&,cbtCollisionObjectWrapper_const*,cbtCollisionWorld
::ConvexResultCallback&,float)::cbtCompoundLeafCallback::
ProcessChild(int,cbtTransform_const&,cbtCollisionShape_const*)::LocalInfoAdder::
addSingleResult(cbtCollisionWorld::LocalConvexResult__bool_(void *this,LocalConvexResult *r,bool b)

{
  cbtScalar cVar1;
  LocalShapeInfo shapeInfo;
  LocalShapeInfo local_10;
  
  local_10.m_shapePart = -1;
  local_10.m_triangleIndex = *(int *)((long)this + 0x20);
  if (r->m_localShapeInfo == (LocalShapeInfo *)0x0) {
    r->m_localShapeInfo = &local_10;
  }
  cVar1 = (cbtScalar)
          (**(code **)(**(long **)((long)this + 0x18) + 0x18))(*(long **)((long)this + 0x18),r,b);
  *(undefined4 *)((long)this + 8) = *(undefined4 *)(*(long *)((long)this + 0x18) + 8);
  return cVar1;
}

Assistant:

virtual cbtScalar addSingleResult(cbtCollisionWorld::LocalConvexResult& r, bool b)
							{
								cbtCollisionWorld::LocalShapeInfo shapeInfo;
								shapeInfo.m_shapePart = -1;
								shapeInfo.m_triangleIndex = m_i;
								if (r.m_localShapeInfo == NULL)
									r.m_localShapeInfo = &shapeInfo;
								const cbtScalar result = m_userCallback->addSingleResult(r, b);
								m_closestHitFraction = m_userCallback->m_closestHitFraction;
								return result;
							}